

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O1

bool anon_unknown.dwarf_6059afd::ns::operator==(Value *lhs,Value *rhs)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (lhs->name)._M_string_length;
  if (__n == (rhs->name)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((lhs->name)._M_dataplus._M_p,(rhs->name)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(lhs->value == rhs->value & bVar2);
}

Assistant:

bool operator==(const Value& lhs, const Value& rhs)
        {
            return lhs.name == rhs.name && lhs.value == rhs.value;
        }